

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat_pixel_resize.cpp
# Opt level: O0

void ncnn::resize_bilinear_yuv420sp(uchar *src,int srcw,int srch,uchar *dst,int w,int h)

{
  long lVar1;
  uchar *in_RCX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  undefined4 in_R8D;
  undefined4 in_R9D;
  uchar *dstUV;
  uchar *srcUV;
  uchar *dstY;
  uchar *srcY;
  undefined8 in_stack_ffffffffffffffc8;
  long lVar2;
  
  lVar2 = in_RDI;
  resize_bilinear_c1((uchar *)CONCAT44(in_R8D,in_R9D),(int)((ulong)in_RDI >> 0x20),(int)in_RDI,
                     in_RCX,(int)((ulong)in_stack_ffffffffffffffc8 >> 0x20),
                     (int)in_stack_ffffffffffffffc8);
  lVar1 = in_RDI + in_ESI * in_EDX;
  resize_bilinear_c2((uchar *)CONCAT44(in_R8D,in_R9D),(int)((ulong)lVar2 >> 0x20),(int)lVar2,in_RCX,
                     (int)((ulong)lVar1 >> 0x20),(int)lVar1);
  return;
}

Assistant:

void resize_bilinear_yuv420sp(const unsigned char* src, int srcw, int srch, unsigned char* dst, int w, int h)
{
    // assert srcw % 2 == 0
    // assert srch % 2 == 0
    // assert w % 2 == 0
    // assert h % 2 == 0

    const unsigned char* srcY = src;
    unsigned char* dstY = dst;
    resize_bilinear_c1(srcY, srcw, srch, dstY, w, h);

    const unsigned char* srcUV = src + srcw * srch;
    unsigned char* dstUV = dst + w * h;
    resize_bilinear_c2(srcUV, srcw / 2, srch / 2, dstUV, w / 2, h / 2);
}